

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O2

Classification *
identifyClassfification(Classification *__return_storage_ptr__,string *classification)

{
  ClassKind *pCVar1;
  char cVar2;
  ulong local_30;
  
  __return_storage_ptr__->extended = false;
  __return_storage_ptr__->visible = true;
  pCVar1 = &__return_storage_ptr__->classKind;
  __return_storage_ptr__->classKind = None;
  __return_storage_ptr__->defKind = None;
  *(undefined8 *)&__return_storage_ptr__->sectionLevel = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->validEnvs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->validEnvs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->validEnvs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (__return_storage_ptr__->behavesLike)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->behavesLike).field_2;
  (__return_storage_ptr__->behavesLike)._M_string_length = 0;
  (__return_storage_ptr__->behavesLike).field_2._M_local_buf[0] = '\0';
  for (local_30 = 0; local_30 < classification->_M_string_length; local_30 = local_30 + 1) {
    cVar2 = (classification->_M_dataplus)._M_p[local_30];
    switch(cVar2) {
    case 'B':
      __return_storage_ptr__->defKind = Color;
      break;
    case 'C':
    case 'c':
      __return_storage_ptr__->defKind = Citation;
      break;
    case 'D':
      __return_storage_ptr__->defKind = Todo;
      break;
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'I':
    case 'J':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'W':
    case 'X':
    case 'Y':
    case 'Z':
    case '[':
    case ']':
    case '^':
    case '_':
    case '`':
    case 'a':
    case 'e':
    case 'f':
    case 'h':
    case 'j':
    case 'k':
    case 'o':
    case 'p':
    case 'q':
      goto switchD_00168630_caseD_45;
    case 'K':
      __return_storage_ptr__->defKind = Bracketlike;
      break;
    case 'L':
      __return_storage_ptr__->defKind = Structure;
      local_30 = local_30 + 1;
      extractStructureLevel(__return_storage_ptr__,classification,&local_30);
      break;
    case 'M':
      break;
    case 'N':
      __return_storage_ptr__->defKind = Newtheorem;
      break;
    case 'S':
      __return_storage_ptr__->visible = false;
      break;
    case 'T':
      *pCVar1 = Tabbing;
      break;
    case 'U':
      __return_storage_ptr__->defKind = Url;
      break;
    case 'V':
      __return_storage_ptr__->defKind = Verbatim;
      break;
    case '\\':
      local_30 = local_30 + 1;
      extractLikeEnv(__return_storage_ptr__,classification,&local_30);
      break;
    case 'b':
      __return_storage_ptr__->defKind = Bibliography;
      break;
    case 'd':
      __return_storage_ptr__->defKind = Definition;
      break;
    case 'g':
      __return_storage_ptr__->defKind = Graphics;
      break;
    case 'i':
      __return_storage_ptr__->defKind = File;
      break;
    case 'l':
      __return_storage_ptr__->defKind = Label;
      break;
    case 'm':
      *pCVar1 = Math;
      break;
    case 'n':
      *pCVar1 = Text;
      break;
    case 'r':
      __return_storage_ptr__->defKind = Reference;
      break;
    case 's':
      __return_storage_ptr__->defKind = Special;
      break;
    case 't':
      *pCVar1 = Tabular;
      break;
    case 'u':
      __return_storage_ptr__->defKind = Package;
      break;
    default:
      if (cVar2 == '*') {
        __return_storage_ptr__->extended = true;
      }
      else {
        if (cVar2 != '/') {
          return __return_storage_ptr__;
        }
        local_30 = local_30 + 1;
        extractValidEnvs(__return_storage_ptr__,classification,&local_30);
      }
    }
  }
switchD_00168630_caseD_45:
  return __return_storage_ptr__;
}

Assistant:

Classification identifyClassfification (string &classification) {
    Classification result {};

    for (size_t i = 0; i < classification.size(); i++) {
        auto c = classification[i];
        switch (c) {
            case '*': result.extended = true; break;
            case 'S': result.visible = false; break;
            case 'M': break; // TODO
            case 'm': result.classKind = ClassKind::Math; break;
            case 't': result.classKind = ClassKind::Tabular; break;
            case 'T': result.classKind = ClassKind::Tabbing; break;
            case 'n': result.classKind = ClassKind::Text; break;
            case 'r': result.defKind = DefKind::Reference; break;
            case 'c': result.defKind = DefKind::Citation; break;
            case 'C': result.defKind = DefKind::Citation; break; // TODO
            case 'l': result.defKind = DefKind::Label; break;
            case 'd': result.defKind = DefKind::Definition; break;
            case 'g': result.defKind = DefKind::Graphics; break;
            case 'i': result.defKind = DefKind::File; break;
            case 'u': result.defKind = DefKind::Package; break;
            case 'b': result.defKind = DefKind::Bibliography; break;
            case 'U': result.defKind = DefKind::Url; break;
            case 'K': result.defKind = DefKind::Bracketlike; break;
            case 'D': result.defKind = DefKind::Todo; break;
            case 'B': result.defKind = DefKind::Color; break;
            case 's': result.defKind = DefKind::Special; break;
            case 'V': result.defKind = DefKind::Verbatim; break;
            case 'N': result.defKind = DefKind::Newtheorem; break;
            case 'L':
                result.defKind = DefKind::Structure;
                extractStructureLevel(result, classification, ++i);
                break;
            case '/':
                extractValidEnvs(result, classification, ++i);
                break;
            case '\\':
                extractLikeEnv(result, classification, ++i);
                break;
            default: {
                return result; // skip unknown
            }
        }
    }

    return result;
}